

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O0

HRESULT __thiscall
Js::ScriptContext::SerializeParserState
          (ScriptContext *this,byte *script,size_t cb,SRCINFO *pSrcInfo,CompileScriptException *pse,
          Utf8SourceInfo **ppSourceInfo,char16 *rootDisplayName,LoadScriptFlag loadScriptFlag,
          byte **buffer,DWORD *bufferSize,ArenaAllocator *alloc,JavascriptFunction **function,
          Var scriptSource)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  JavascriptFunction *pJVar4;
  FunctionBody *function_00;
  Utf8SourceInfo *this_00;
  size_t sVar5;
  LPCUTF8 utf8Source;
  SRCINFO *srcInfo;
  OutOfMemoryException anon_var_0;
  StackOverflowException anon_var_0_1;
  DWORD dwFlags;
  LPCUTF8 utf8Code;
  size_t cSourceCodeLength;
  Utf8SourceInfo *sourceInfo;
  FunctionBody *functionBody;
  Parser parser;
  AutoDynamicCodeReference dynamicFunctionReference;
  AutoNestedHandledExceptionType local_50;
  HRESULT local_4c;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  HRESULT hr;
  Utf8SourceInfo **ppSourceInfo_local;
  CompileScriptException *pse_local;
  SRCINFO *pSrcInfo_local;
  size_t cb_local;
  byte *script_local;
  ScriptContext *this_local;
  
  ___autoNestedHandledExceptionType = ppSourceInfo;
  bVar2 = ThreadContext::IsScriptActive(this->threadContext);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0x9c5,"(!this->threadContext->IsScriptActive())",
                                "!this->threadContext->IsScriptActive()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (pse == (CompileScriptException *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0x9c6,"(pse != nullptr)","pse != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (alloc == (ArenaAllocator *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0x9c7,"(alloc != nullptr)","alloc != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (function == (JavascriptFunction **)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0x9c8,"(function != nullptr)","function != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  *function = (JavascriptFunction *)0x0;
  local_4c = 0;
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (&local_50,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
  AutoDynamicCodeReference::AutoDynamicCodeReference
            ((AutoDynamicCodeReference *)&parser.m_deferringAST,this);
  Parser::Parser((Parser *)&functionBody,this,0,(PageAllocator *)0x0,false,0xaa8);
  pJVar4 = LoadScriptInternal(this,(Parser *)&functionBody,script,cb,pSrcInfo,pse,
                              ___autoNestedHandledExceptionType,rootDisplayName,loadScriptFlag,
                              scriptSource);
  *function = pJVar4;
  pJVar4 = *function;
  if (pJVar4 == (JavascriptFunction *)0x0) {
    local_4c = -0x7fffbffb;
  }
  else {
    function_00 = JavascriptFunction::GetFunctionBody(*function);
    this_00 = FunctionProxy::GetUtf8SourceInfo((FunctionProxy *)function_00);
    sVar5 = Utf8SourceInfo::GetCbLength(this_00,L"JsSerializeParserState");
    utf8Source = Utf8SourceInfo::GetSource(this_00,L"JsSerializeParserState");
    utf8Code._0_4_ = (DWORD)sVar5;
    srcInfo = FunctionProxy::GetHostSrcInfo((FunctionProxy *)function_00);
    this_local._4_4_ =
         ByteCodeSerializer::SerializeToBuffer
                   (this,alloc,(DWORD)utf8Code,utf8Source,function_00,srcInfo,buffer,bufferSize,4);
  }
  Parser::~Parser((Parser *)&functionBody);
  AutoDynamicCodeReference::~AutoDynamicCodeReference
            ((AutoDynamicCodeReference *)&parser.m_deferringAST);
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(&local_50);
  if (pJVar4 == (JavascriptFunction *)0x0) {
    CompileScriptException::ProcessError(pse,(IScanner *)0x0,local_4c,(ParseNode *)0x0,L"",L"");
    this_local._4_4_ = local_4c;
  }
  return this_local._4_4_;
}

Assistant:

HRESULT ScriptContext::SerializeParserState(const byte* script, size_t cb,
        SRCINFO const * pSrcInfo, CompileScriptException * pse, Utf8SourceInfo** ppSourceInfo,
        const char16 *rootDisplayName, LoadScriptFlag loadScriptFlag, byte** buffer,
        DWORD* bufferSize, ArenaAllocator* alloc, JavascriptFunction** function, Js::Var scriptSource)
    {
        Assert(!this->threadContext->IsScriptActive());
        Assert(pse != nullptr);
        Assert(alloc != nullptr);
        Assert(function != nullptr);

        *function = nullptr;
        HRESULT hr = NOERROR;

        try
        {
            AUTO_NESTED_HANDLED_EXCEPTION_TYPE((ExceptionType)(ExceptionType_OutOfMemory | ExceptionType_StackOverflow));
            Js::AutoDynamicCodeReference dynamicFunctionReference(this);
            Parser parser(this);
            *function = LoadScriptInternal(&parser, script, cb, pSrcInfo, pse, ppSourceInfo, rootDisplayName, loadScriptFlag, scriptSource);

            if (*function != nullptr)
            {
                Js::FunctionBody *functionBody = (*function)->GetFunctionBody();
                const Js::Utf8SourceInfo *sourceInfo = functionBody->GetUtf8SourceInfo();
                size_t cSourceCodeLength = sourceInfo->GetCbLength(_u("JsSerializeParserState"));
                LPCUTF8 utf8Code = sourceInfo->GetSource(_u("JsSerializeParserState"));
                DWORD dwFlags = GENERATE_BYTE_CODE_PARSER_STATE;

                return Js::ByteCodeSerializer::SerializeToBuffer(this,
                    alloc, static_cast<DWORD>(cSourceCodeLength), utf8Code,
                    functionBody, functionBody->GetHostSrcInfo(), buffer,
                    bufferSize, dwFlags);
            }
            else
            {
                hr = E_FAIL;
            }
        }
        catch (Js::OutOfMemoryException)
        {
            hr = E_OUTOFMEMORY;
        }
        catch (Js::StackOverflowException)
        {
            hr = VBSERR_OutOfStack;
        }
        pse->ProcessError(nullptr, hr, nullptr);
        return hr;
    }